

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float64_eq_quiet_mips(float64 a,float64 b,float_status *status)

{
  int iVar1;
  float64 a_;
  float64 a__00;
  
  a_ = float64_squash_input_denormal_mips(a,status);
  a__00 = float64_squash_input_denormal_mips(b,status);
  if (((~a_ & 0x7ff0000000000000) != 0 || (a_ & 0xfffffffffffff) == 0) &&
     ((a__00 & 0xfffffffffffff) == 0 || (~a__00 & 0x7ff0000000000000) != 0)) {
    return (uint)(((a__00 | a_) & 0x7fffffffffffffff) == 0 || a_ == a__00);
  }
  iVar1 = float64_is_signaling_nan_mips(a_,status);
  if ((iVar1 != 0) || (iVar1 = float64_is_signaling_nan_mips(a__00,status), iVar1 != 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return 0;
}

Assistant:

int float64_eq_quiet(float64 a, float64 b, float_status *status)
{
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    av = float64_val(a);
    bv = float64_val(b);
    return ( av == bv ) || ( (uint64_t) ( ( av | bv )<<1 ) == 0 );

}